

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ParenPragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParenPragmaExpressionSyntax,slang::syntax::ParenPragmaExpressionSyntax_const&>
          (BumpAllocator *this,ParenPragmaExpressionSyntax *args)

{
  ParenPragmaExpressionSyntax *pPVar1;
  ParenPragmaExpressionSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pPVar1 = (ParenPragmaExpressionSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ParenPragmaExpressionSyntax::ParenPragmaExpressionSyntax(in_RSI,pPVar1);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }